

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qthreadpool.cpp
# Opt level: O0

void QThreadPool::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int iVar1;
  uint uVar2;
  Priority PVar3;
  QThreadPool *in_RCX;
  uint in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  QThreadPool *unaff_retaddr;
  int in_stack_0000000c;
  void *_v_1;
  void *_v;
  QThreadPool *_t;
  QThreadPool *in_stack_ffffffffffffffc8;
  QThreadPool *this;
  int maxThreadCount;
  
  maxThreadCount = (int)((ulong)in_RDI >> 0x20);
  if (in_ESI == 1) {
    this = (QThreadPool *)(in_RCX->super_QObject)._vptr_QObject;
    in_stack_ffffffffffffffc8 = (QThreadPool *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffffc8) {
    case (QThreadPool *)0x0:
      iVar1 = expiryTimeout(unaff_retaddr);
      *(int *)&(this->super_QObject)._vptr_QObject = iVar1;
      break;
    case (QThreadPool *)0x1:
      iVar1 = QThreadPool::maxThreadCount(in_stack_ffffffffffffffc8);
      *(int *)&(this->super_QObject)._vptr_QObject = iVar1;
      break;
    case (QThreadPool *)0x2:
      iVar1 = activeThreadCount(this);
      *(int *)&(this->super_QObject)._vptr_QObject = iVar1;
      break;
    case (QThreadPool *)0x3:
      uVar2 = stackSize(in_stack_ffffffffffffffc8);
      *(uint *)&(this->super_QObject)._vptr_QObject = uVar2;
      break;
    case (QThreadPool *)0x4:
      PVar3 = threadPriority(in_stack_ffffffffffffffc8);
      *(Priority *)&(this->super_QObject)._vptr_QObject = PVar3;
    }
  }
  if (in_ESI == 2) {
    switch(in_EDX) {
    case 0:
      setExpiryTimeout(in_RCX,in_stack_0000000c);
      break;
    case 1:
      setMaxThreadCount(in_RCX,maxThreadCount);
      break;
    default:
      break;
    case 3:
      setStackSize(in_stack_ffffffffffffffc8,0);
      break;
    case 4:
      setThreadPriority(in_stack_ffffffffffffffc8,IdlePriority);
    }
  }
  return;
}

Assistant:

void QThreadPool::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QThreadPool *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->expiryTimeout(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->maxThreadCount(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->activeThreadCount(); break;
        case 3: *reinterpret_cast<uint*>(_v) = _t->stackSize(); break;
        case 4: *reinterpret_cast<QThread::Priority*>(_v) = _t->threadPriority(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setExpiryTimeout(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setMaxThreadCount(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setStackSize(*reinterpret_cast<uint*>(_v)); break;
        case 4: _t->setThreadPriority(*reinterpret_cast<QThread::Priority*>(_v)); break;
        default: break;
        }
    }
}